

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O2

int __thiscall net_uv::KCPSocket::connect(KCPSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  sockaddr *addr;
  uv_udp_t *puVar4;
  int32_t errcode;
  undefined4 in_register_00000034;
  char *ip;
  allocator<char> local_41;
  sockaddr_in bind_addr;
  
  ip = (char *)CONCAT44(in_register_00000034,__fd);
  if (this->m_kcpState == CLOSED) {
    addr = net_getsocketAddr(ip,(uint32_t)__addr,(uint32_t *)0x0);
    if (addr == (sockaddr *)0x0) {
      net_uvLog(3,"[%s:%d]Address resolution failed",ip,(ulong)__addr & 0xffffffff);
      return 0;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&bind_addr,ip,&local_41);
    std::__cxx11::string::_M_assign((string *)&(this->super_Socket).m_ip);
    std::__cxx11::string::~string((string *)&bind_addr);
    (this->super_Socket).m_port = (uint32_t)__addr;
    setSocketAddr(this,addr);
    this->m_soType = CLI_SO;
    puVar4 = this->m_udp;
    if (puVar4 == (uv_udp_t *)0x0) {
      puVar4 = (uv_udp_t *)malloc(0xd8);
      this->m_udp = puVar4;
      uv_udp_init((this->super_Socket).m_loop,puVar4);
      this->m_udp->data = this;
      uv_ip4_addr("0.0.0.0",0,&bind_addr);
      uv_udp_bind(this->m_udp,(sockaddr *)&bind_addr,0);
      net_adjustBuffSize((uv_handle_t *)this->m_udp,0x10000,0x10000);
      puVar4 = this->m_udp;
    }
    uVar1 = uv_udp_recv_start(puVar4,Socket::uv_on_alloc_buffer,uv_on_after_read);
    if (uVar1 == 0) {
      changeState(this,SYN_SENT);
      iVar2 = rand();
      iVar3 = rand();
      uVar1 = iVar2 % 1000 + iVar3 % 1000 + 1000;
      this->m_randValue = uVar1;
      kcp_making_syn_abi_cxx11_((string *)&bind_addr,(net_uv *)(ulong)uVar1,iVar3 % 1000);
      udpSendStr(this,(string *)&bind_addr);
      std::__cxx11::string::~string((string *)&bind_addr);
      startIdle(this);
      return (int)CONCAT71((int7)((ulong)this >> 8),1);
    }
    net_getUVError_abi_cxx11_((string *)&bind_addr,(net_uv *)(ulong)uVar1,errcode);
    net_uvLog(3,"uv_udp_recv_start error: %s",bind_addr._0_8_);
    std::__cxx11::string::~string((string *)&bind_addr);
  }
  return 0;
}

Assistant:

bool KCPSocket::connect(const char* ip, uint32_t port)
{
	if (m_kcpState != State::CLOSED)
	{
		return false;
	}

	struct sockaddr* addr = net_getsocketAddr(ip, port, NULL);

	if (addr == NULL)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "[%s:%d]Address resolution failed", ip, port);
		return false;
	}

	this->setIp(ip);
	this->setPort(port);
	this->setSocketAddr(addr);
	this->m_soType = KCPSOType::CLI_SO;

	if (m_udp == NULL)
	{
		m_udp = (uv_udp_t*)fc_malloc(sizeof(uv_udp_t));
		int32_t r = uv_udp_init(m_loop, m_udp);
		CHECK_UV_ASSERT(r);
		m_udp->data = this;

		struct sockaddr_in bind_addr;
		r = uv_ip4_addr("0.0.0.0", 0, &bind_addr);
		CHECK_UV_ASSERT(r);
		r = uv_udp_bind(m_udp, (const struct sockaddr *)&bind_addr, 0);
		CHECK_UV_ASSERT(r);
		//r = uv_udp_set_broadcast(m_udp, 1);
		//CHECK_UV_ASSERT(r);

		net_adjustBuffSize((uv_handle_t*)m_udp, KCP_UV_SOCKET_RECV_BUF_LEN, KCP_UV_SOCKET_SEND_BUF_LEN);
	}

	int32_t r = uv_udp_recv_start(m_udp, uv_on_alloc_buffer, uv_on_after_read);
	if (r != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "uv_udp_recv_start error: %s", net_getUVError(r).c_str());
		return false;
	}

	changeState(State::SYN_SENT);
	m_randValue = std::rand() % 1000 + std::rand() % 1000 + 1000;
	this->udpSendStr(kcp_making_syn(m_randValue));

	startIdle();

	return true;
}